

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

void __thiscall QMakeEvaluator::skipExpression(QMakeEvaluator *this,ushort **pTokPtr)

{
  ushort uVar1;
  ushort *puVar2;
  ushort *puVar3;
  
  puVar2 = *pTokPtr;
  while( true ) {
    do {
      while (puVar3 = puVar2, uVar1 = *puVar3, uVar1 == 1) {
        (this->m_current).line = puVar3[1];
        puVar2 = puVar3 + 2;
      }
      puVar2 = puVar3 + 1;
    } while (uVar1 == 0xe);
    if ((uVar1 == 7) || (uVar1 == 0xf)) break;
    switch((char)uVar1) {
    case '\b':
    case '\f':
      puVar2 = puVar3 + (ulong)puVar3[1] + 2;
      break;
    case '\t':
    case '\n':
    case '\v':
      puVar2 = puVar3 + (ulong)puVar3[3] + 4;
      break;
    case '\r':
      *pTokPtr = puVar3 + (ulong)puVar3[3] + 4;
      skipExpression(this,pTokPtr);
      puVar2 = *pTokPtr;
    }
  }
  *pTokPtr = puVar2;
  return;
}

Assistant:

void QMakeEvaluator::skipExpression(const ushort *&pTokPtr)
{
    const ushort *tokPtr = pTokPtr;
    forever {
        ushort tok = *tokPtr++;
        switch (tok) {
        case TokLine:
            m_current.line = *tokPtr++;
            break;
        case TokValueTerminator:
        case TokFuncTerminator:
            pTokPtr = tokPtr;
            return;
        case TokArgSeparator:
            break;
        default:
            switch (tok & TokMask) {
            case TokLiteral:
            case TokEnvVar:
                skipStr(tokPtr);
                break;
            case TokHashLiteral:
            case TokVariable:
            case TokProperty:
                skipHashStr(tokPtr);
                break;
            case TokFuncName:
                skipHashStr(tokPtr);
                pTokPtr = tokPtr;
                skipExpression(pTokPtr);
                tokPtr = pTokPtr;
                break;
            default:
                Q_ASSERT_X(false, "skipExpression", "Unrecognized token");
                break;
            }
        }
    }